

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ImplicitNonAnsiPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitNonAnsiPortSyntax,slang::syntax::ImplicitNonAnsiPortSyntax_const&>
          (BumpAllocator *this,ImplicitNonAnsiPortSyntax *args)

{
  ImplicitNonAnsiPortSyntax *pIVar1;
  undefined8 *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pIVar1 = (ImplicitNonAnsiPortSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  *(undefined8 *)&(pIVar1->super_NonAnsiPortSyntax).super_SyntaxNode = *in_RSI;
  (pIVar1->super_NonAnsiPortSyntax).super_SyntaxNode.parent = (SyntaxNode *)in_RSI[1];
  (pIVar1->super_NonAnsiPortSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)in_RSI[2];
  (pIVar1->expr).ptr = (PortExpressionSyntax *)in_RSI[3];
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }